

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSerializeToXmlString
          (MessageGenerator *this,Printer *printer)

{
  Printer *printer_local;
  MessageGenerator *this_local;
  
  io::Printer::Print(printer,"bool $classname$::SerializeToXmlString(std::string* output) const {\n"
                     ,"classname",&this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"output->clear();\n");
  io::Printer::Print(printer,
                     "if (!this->IsInitialized()) {\n  GOOGLE_LOG(WARNING)\n    << \"SerializeToXmlString failed: missing required fields: \"\n    << this->InitializationErrorString();\n  return false;\n}\n"
                    );
  io::Printer::Print(printer,"\n");
  io::Printer::Print(printer,
                     "::google::protobuf::xml::XmlMessage stub(*const_cast<$classname$*>(this));\n",
                     "classname",&this->classname_);
  io::Printer::Print(printer,"output->assign(stub.SerializeToString());\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return true;\n}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeToXmlString(io::Printer* printer) {
  printer->Print(
    "bool $classname$::SerializeToXmlString(std::string* output) const {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "output->clear();\n");
  printer->Print(
    "if (!this->IsInitialized()) {\n"
    "  GOOGLE_LOG(WARNING)\n"
    "    << \"SerializeToXmlString failed: missing required fields: \"\n"
    "    << this->InitializationErrorString();\n"
    "  return false;\n"
    "}\n");
  printer->Print(
    "\n");
  printer->Print(
    "::google::protobuf::xml::XmlMessage stub(*const_cast<$classname$*>(this));\n",
    "classname", classname_);
  printer->Print(
    "output->assign(stub.SerializeToString());\n");

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}